

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

size_t ExtensionObject_calcSizeBinary(UA_ExtensionObject *src,UA_DataType *_)

{
  UA_DataType *pUVar1;
  size_t sVar2;
  size_t sVar3;
  uint local_3c;
  size_t encode_index;
  UA_DataType *type;
  size_t s;
  UA_DataType *__local;
  UA_ExtensionObject *src_local;
  
  if (src->encoding < UA_EXTENSIONOBJECT_DECODED) {
    sVar2 = NodeId_calcSizeBinary(&(src->content).encoded.typeId,(UA_DataType *)0x0);
    type = (UA_DataType *)(sVar2 + 1);
    if (src->encoding != UA_EXTENSIONOBJECT_ENCODED_NOBODY) {
      if (1 < src->encoding - UA_EXTENSIONOBJECT_ENCODED_BYTESTRING) {
        return 0;
      }
      sVar2 = String_calcSizeBinary(&(src->content).encoded.body,(UA_DataType *)0x0);
      type = (UA_DataType *)((long)&type->typeName + sVar2);
    }
  }
  else {
    if (((src->content).decoded.type == (UA_DataType *)0x0) ||
       ((src->content).decoded.data == (void *)0x0)) {
      return 0;
    }
    if ((((src->content).decoded.type)->typeId).identifierType != UA_NODEIDTYPE_NUMERIC) {
      return 0;
    }
    sVar2 = NodeId_calcSizeBinary(&((src->content).decoded.type)->typeId,(UA_DataType *)0x0);
    pUVar1 = (src->content).decoded.type;
    if ((pUVar1->field_0x25 & 1) == 0) {
      local_3c = 0x19;
    }
    else {
      local_3c = (uint)pUVar1->typeIndex;
    }
    sVar3 = (*calcSizeBinaryJumpTable[local_3c])((src->content).decoded.data,pUVar1);
    type = (UA_DataType *)(sVar3 + sVar2 + 5);
  }
  return (size_t)type;
}

Assistant:

static size_t
ExtensionObject_calcSizeBinary(const UA_ExtensionObject *src, UA_DataType *_) {
    size_t s = 1; // encoding byte
    if(src->encoding > UA_EXTENSIONOBJECT_ENCODED_XML) {
        if(!src->content.decoded.type || !src->content.decoded.data)
            return 0;
        if(src->content.decoded.type->typeId.identifierType != UA_NODEIDTYPE_NUMERIC)
            return 0;
        s += NodeId_calcSizeBinary(&src->content.decoded.type->typeId, NULL);
        s += 4; // length
        const UA_DataType *type = src->content.decoded.type;
        size_t encode_index = type->builtin ? type->typeIndex : UA_BUILTIN_TYPES_COUNT;
        s += calcSizeBinaryJumpTable[encode_index](src->content.decoded.data, type);
    } else {
        s += NodeId_calcSizeBinary(&src->content.encoded.typeId, NULL);
        switch (src->encoding) {
        case UA_EXTENSIONOBJECT_ENCODED_NOBODY:
            break;
        case UA_EXTENSIONOBJECT_ENCODED_BYTESTRING:
        case UA_EXTENSIONOBJECT_ENCODED_XML:
            s += String_calcSizeBinary(&src->content.encoded.body, NULL);
            break;
        default:
            return 0;
        }
    }
    return s;
}